

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

void __thiscall
CFFFileInput::SetupSIDToGlyphMapWithStandard
          (CFFFileInput *this,unsigned_short *inStandardCharSet,
          unsigned_short inStandardCharSetLength,UShortToCharStringMap *ioCharMap,
          CharStrings *inCharStrings)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  pair<const_unsigned_short,_IndexElement_*> local_40;
  
  local_40.first = 0;
  local_40.second = inCharStrings->mCharStringsIndex;
  std::
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
  ::_M_insert_unique<std::pair<unsigned_short_const,IndexElement*>>
            ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
              *)ioCharMap,&local_40);
  if ((1 < inStandardCharSetLength) && (1 < inCharStrings->mCharStringsCount)) {
    lVar1 = 0x18;
    uVar2 = 2;
    do {
      local_40.second =
           (IndexElement *)((long)&inCharStrings->mCharStringsIndex->mStartPosition + lVar1);
      local_40.first = inStandardCharSet[uVar2 - 1];
      std::
      _Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
      ::_M_insert_unique<std::pair<unsigned_short_const,IndexElement*>>
                ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
                  *)ioCharMap,&local_40);
      if (inStandardCharSetLength <= uVar2) {
        return;
      }
      lVar1 = lVar1 + 0x18;
      bVar3 = uVar2 < inCharStrings->mCharStringsCount;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void CFFFileInput::SetupSIDToGlyphMapWithStandard(	const unsigned short* inStandardCharSet,
													unsigned short inStandardCharSetLength,
													UShortToCharStringMap& ioCharMap,
													const CharStrings& inCharStrings)
{
	ioCharMap.insert(UShortToCharStringMap::value_type(0,inCharStrings.mCharStringsIndex));
	unsigned short i;
	for(i = 1; i < inCharStrings.mCharStringsCount && i < inStandardCharSetLength;++i)
	{
		ioCharMap.insert(UShortToCharStringMap::value_type(
				inStandardCharSet[i],inCharStrings.mCharStringsIndex + i));
	}
}